

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

Board * board_dup(Board *board)

{
  Board *pBVar1;
  Spot **ppSVar2;
  Spot *pSVar3;
  void *pvVar4;
  Board *in_RDI;
  Board *dupBoard;
  uchar i;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar5;
  
  pBVar1 = board_create();
  if (in_RDI->spotsCount != '\0') {
    ppSVar2 = (Spot **)malloc((ulong)in_RDI->spotsCount << 3);
    pBVar1->spots = ppSVar2;
    pBVar1->spotsCount = in_RDI->spotsCount;
    for (bVar5 = 0; bVar5 < in_RDI->spotsCount; bVar5 = bVar5 + 1) {
      pSVar3 = spot_dup((Spot *)CONCAT17(bVar5,in_stack_fffffffffffffff0));
      pBVar1->spots[bVar5] = pSVar3;
    }
  }
  if ((in_RDI->gameState != (void *)0x0) &&
     ((gConfig.game)->dupGameState != (_func_void_ptr_Board_ptr *)0x0)) {
    pvVar4 = (*(gConfig.game)->dupGameState)(in_RDI);
    pBVar1->gameState = pvVar4;
  }
  return pBVar1;
}

Assistant:

Board * board_dup(Board * board)
{
	unsigned char i;
	Board * dupBoard = board_create();
	if(board->spotsCount>0)
	{
		dupBoard->spots = (Spot **)malloc(sizeof(Spot *)*board->spotsCount);
		dupBoard->spotsCount = board->spotsCount;
		for(i=0;i<board->spotsCount;i++)
		{
			dupBoard->spots[i] = spot_dup(board->spots[i]);
		}
	}
	if(board->gameState!=0 && gConfig.game->dupGameState!=0)
		dupBoard->gameState = gConfig.game->dupGameState(board);

	return dupBoard;
}